

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example008_miller_rabin_prime.cpp
# Opt level: O2

bool math::wide_integer::example008_miller_rabin_prime(void)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  
  bVar1 = 1;
  iVar2 = 8;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    bVar3 = local_example008_miller_rabin_prime::example008_miller_rabin_prime_run();
    bVar1 = bVar1 & bVar3;
  }
  bVar3 = local_example008_miller_rabin_prime::example008_miller_rabin_prime_check_known_primes();
  return (bool)(bVar3 & bVar1);
}

Assistant:

auto ::math::wide_integer::example008_miller_rabin_prime() -> bool
#endif
{
  auto result_is_ok = true;

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
  #if !defined(UINTWIDE_T_REDUCE_TEST_DEPTH)
             i < static_cast<unsigned>(UINT8_C(8));
  #else
             i < static_cast<unsigned>(UINT8_C(1));
  #endif
           ++i)
  {
    const auto result_prime_run_is_ok =
      local_example008_miller_rabin_prime::example008_miller_rabin_prime_run();
  
    result_is_ok = (result_prime_run_is_ok && result_is_ok);
  }

  {
    const auto result_known_primes_is_ok =
      local_example008_miller_rabin_prime::example008_miller_rabin_prime_check_known_primes();

    result_is_ok = (result_known_primes_is_ok && result_is_ok);
  }

  return result_is_ok;
}